

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_ecc_curve_t mbedtls_ecc_group_to_psa(mbedtls_ecp_group_id grpid,size_t *bits)

{
  size_t *bits_local;
  mbedtls_ecp_group_id grpid_local;
  
  switch(grpid) {
  case MBEDTLS_ECP_DP_SECP192R1:
    *bits = 0xc0;
    bits_local._7_1_ = '\x12';
    break;
  case MBEDTLS_ECP_DP_SECP224R1:
    *bits = 0xe0;
    bits_local._7_1_ = '\x12';
    break;
  case MBEDTLS_ECP_DP_SECP256R1:
    *bits = 0x100;
    bits_local._7_1_ = '\x12';
    break;
  case MBEDTLS_ECP_DP_SECP384R1:
    *bits = 0x180;
    bits_local._7_1_ = '\x12';
    break;
  case MBEDTLS_ECP_DP_SECP521R1:
    *bits = 0x209;
    bits_local._7_1_ = '\x12';
    break;
  case MBEDTLS_ECP_DP_BP256R1:
    *bits = 0x100;
    bits_local._7_1_ = '0';
    break;
  case MBEDTLS_ECP_DP_BP384R1:
    *bits = 0x180;
    bits_local._7_1_ = '0';
    break;
  case MBEDTLS_ECP_DP_BP512R1:
    *bits = 0x200;
    bits_local._7_1_ = '0';
    break;
  case MBEDTLS_ECP_DP_CURVE25519:
    *bits = 0xff;
    bits_local._7_1_ = 'A';
    break;
  case MBEDTLS_ECP_DP_SECP192K1:
    *bits = 0xc0;
    bits_local._7_1_ = '\x17';
    break;
  case MBEDTLS_ECP_DP_SECP224K1:
    *bits = 0xe0;
    bits_local._7_1_ = '\x17';
    break;
  case MBEDTLS_ECP_DP_SECP256K1:
    *bits = 0x100;
    bits_local._7_1_ = '\x17';
    break;
  case MBEDTLS_ECP_DP_CURVE448:
    *bits = 0x1c0;
    bits_local._7_1_ = 'A';
    break;
  default:
    bits_local._7_1_ = '\0';
  }
  return bits_local._7_1_;
}

Assistant:

psa_ecc_curve_t mbedtls_ecc_group_to_psa( mbedtls_ecp_group_id grpid,
                                          size_t *bits )
{
    switch( grpid )
    {
        case MBEDTLS_ECP_DP_SECP192R1:
            *bits = 192;
            return( PSA_ECC_CURVE_SECP_R1 );
        case MBEDTLS_ECP_DP_SECP224R1:
            *bits = 224;
            return( PSA_ECC_CURVE_SECP_R1 );
        case MBEDTLS_ECP_DP_SECP256R1:
            *bits = 256;
            return( PSA_ECC_CURVE_SECP_R1 );
        case MBEDTLS_ECP_DP_SECP384R1:
            *bits = 384;
            return( PSA_ECC_CURVE_SECP_R1 );
        case MBEDTLS_ECP_DP_SECP521R1:
            *bits = 521;
            return( PSA_ECC_CURVE_SECP_R1 );
        case MBEDTLS_ECP_DP_BP256R1:
            *bits = 256;
            return( PSA_ECC_CURVE_BRAINPOOL_P_R1 );
        case MBEDTLS_ECP_DP_BP384R1:
            *bits = 384;
            return( PSA_ECC_CURVE_BRAINPOOL_P_R1 );
        case MBEDTLS_ECP_DP_BP512R1:
            *bits = 512;
            return( PSA_ECC_CURVE_BRAINPOOL_P_R1 );
        case MBEDTLS_ECP_DP_CURVE25519:
            *bits = 255;
            return( PSA_ECC_CURVE_MONTGOMERY );
        case MBEDTLS_ECP_DP_SECP192K1:
            *bits = 192;
            return( PSA_ECC_CURVE_SECP_K1 );
        case MBEDTLS_ECP_DP_SECP224K1:
            *bits = 224;
            return( PSA_ECC_CURVE_SECP_K1 );
        case MBEDTLS_ECP_DP_SECP256K1:
            *bits = 256;
            return( PSA_ECC_CURVE_SECP_K1 );
        case MBEDTLS_ECP_DP_CURVE448:
            *bits = 448;
            return( PSA_ECC_CURVE_MONTGOMERY );
        default:
            return( 0 );
    }
}